

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fn.hpp
# Opt level: O1

maybe<rangeless::fn::impl::seq<rangeless::fn::impl::group_adjacent_as_subseqs_by<rangeless::fn::by::identity,_rangeless::fn::impl::eq>::gen<rangeless::fn::impl::to_seq::gen<std::vector<rangeless::fn::impl::X,_std::allocator<rangeless::fn::impl::X>_>_>_>::subgen>_>
* __thiscall
rangeless::fn::impl::
group_adjacent_as_subseqs_by<rangeless::fn::by::identity,_rangeless::fn::impl::eq>::
gen<rangeless::fn::impl::to_seq::gen<std::vector<rangeless::fn::impl::X,_std::allocator<rangeless::fn::impl::X>_>_>_>
::operator()(maybe<rangeless::fn::impl::seq<rangeless::fn::impl::group_adjacent_as_subseqs_by<rangeless::fn::by::identity,_rangeless::fn::impl::eq>::gen<rangeless::fn::impl::to_seq::gen<std::vector<rangeless::fn::impl::X,_std::allocator<rangeless::fn::impl::X>_>_>_>::subgen>_>
             *__return_storage_ptr__,
            gen<rangeless::fn::impl::to_seq::gen<std::vector<rangeless::fn::impl::X,_std::allocator<rangeless::fn::impl::X>_>_>_>
            *this)

{
  bool bVar1;
  anon_union_4_2_edcbc2ec_for_maybe<rangeless::fn::impl::X>_1 aVar2;
  pointer pXVar3;
  bool bVar4;
  X *pXVar5;
  char local_1c;
  
  bVar1 = (this->current).m_empty;
  if (bVar1 == false) {
    if (this->reached_subend == false) {
      do {
        next((gen<rangeless::fn::impl::to_seq::gen<std::vector<rangeless::fn::impl::X,_std::allocator<rangeless::fn::impl::X>_>_>_>
              *)&stack0xffffffffffffffe0);
        if (local_1c == '\0') {
          local_1c = '\x01';
        }
      } while (this->reached_subend == false);
    }
    goto LAB_0017621a;
  }
  if ((this->in_gen).started == false) {
    (this->in_gen).started = true;
    pXVar5 = (this->in_gen).inps.
             super__Vector_base<rangeless::fn::impl::X,_std::allocator<rangeless::fn::impl::X>_>.
             _M_impl.super__Vector_impl_data._M_start;
LAB_001761e5:
    (this->in_gen).it._M_current = pXVar5;
  }
  else {
    pXVar5 = (this->in_gen).it._M_current;
    if (pXVar5 != (this->in_gen).inps.
                  super__Vector_base<rangeless::fn::impl::X,_std::allocator<rangeless::fn::impl::X>_>
                  ._M_impl.super__Vector_impl_data._M_finish) {
      pXVar5 = pXVar5 + 1;
      goto LAB_001761e5;
    }
  }
  pXVar3 = (this->in_gen).it._M_current;
  if (pXVar3 == (this->in_gen).inps.
                super__Vector_base<rangeless::fn::impl::X,_std::allocator<rangeless::fn::impl::X>_>.
                _M_impl.super__Vector_impl_data._M_finish) {
    bVar4 = true;
    if (bVar1 != false) goto LAB_0017621a;
  }
  else {
    aVar2 = (anon_union_4_2_edcbc2ec_for_maybe<rangeless::fn::impl::X>_1)pXVar3->value;
    if (bVar1 == false) {
      (this->current).m_empty = true;
    }
    (this->current).field_0 = aVar2;
    bVar4 = false;
  }
  (this->current).m_empty = bVar4;
LAB_0017621a:
  if ((this->current).m_empty == true) {
    __return_storage_ptr__->m_empty = true;
  }
  else {
    this->reached_subend = false;
    *(undefined1 *)((long)&__return_storage_ptr__->field_0 + 4) = 1;
    (__return_storage_ptr__->field_0).m_value.m_gen.parent = this;
    *(undefined2 *)((long)&__return_storage_ptr__->field_0 + 0x10) = 0;
    (__return_storage_ptr__->field_0).m_value.m_resumable = false;
    __return_storage_ptr__->m_empty = false;
  }
  return __return_storage_ptr__;
}

Assistant:

maybe<value_type> operator()() // return seq for next group
            {
                if(!current) { // starting initial group
                    current = in_gen();
                } else {

                    // NB: the user-code may have accessed the group only
                    // partially (or not at all), in which case we must skip
                    // over the rest elements in the group until we reach 
                    // the next one.
                    while(!reached_subend) {
                        next();
                    }
                }

                if(!current) { // reached final end
                    return {};
                }

                reached_subend = false;
                return { subgen{ this } };
            }